

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::write_regular_image
          (mipmapped_texture *this,char *pFilename,uint32 image_write_flags)

{
  bool bVar1;
  image_u8 *img;
  image_u8 *pLevel_image;
  image_u8 tmp;
  uint32 image_write_flags_local;
  char *pFilename_local;
  mipmapped_texture *this_local;
  
  tmp.m_pixel_buf.m_capacity = image_write_flags;
  image<crnlib::color_quad<unsigned_char,_int>_>::image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pLevel_image);
  img = get_level_image(this,0,0,(image<crnlib::color_quad<unsigned_char,_int>_> *)&pLevel_image,3);
  bVar1 = image_utils::write_to_file(pFilename,img,tmp.m_pixel_buf.m_capacity,-1);
  if (!bVar1) {
    set_last_error(this,"File write failed");
  }
  image<crnlib::color_quad<unsigned_char,_int>_>::~image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pLevel_image);
  return bVar1;
}

Assistant:

bool mipmapped_texture::write_regular_image(const char* pFilename, uint32 image_write_flags) {
  image_u8 tmp;
  image_u8* pLevel_image = get_level_image(0, 0, tmp);

  if (!image_utils::write_to_file(pFilename, *pLevel_image, image_write_flags)) {
    set_last_error("File write failed");
    return false;
  }

  return true;
}